

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void __thiscall TokenFilter::handleToken(TokenFilter *this,Token *t)

{
  bool bVar1;
  allocator<char> local_141;
  string local_140 [32];
  Token local_120 [127];
  allocator<char> local_a1;
  string local_a0 [32];
  Token local_80 [104];
  Token *local_18;
  Token *t_local;
  TokenFilter *this_local;
  
  local_18 = t;
  t_local = (Token *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"Potato",&local_a1);
  QPDFTokenizer::Token::Token(local_80,tt_string,local_a0);
  bVar1 = QPDFTokenizer::Token::operator==(t,local_80);
  QPDFTokenizer::Token::~Token(local_80);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_140,"Salad",&local_141);
    QPDFTokenizer::Token::Token(local_120,tt_string,local_140);
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
    QPDFTokenizer::Token::~Token(local_120);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  else {
    QPDFObjectHandle::TokenFilter::writeToken((Token *)this);
  }
  return;
}

Assistant:

void
    handleToken(QPDFTokenizer::Token const& t) override
    {
        if (t == QPDFTokenizer::Token(QPDFTokenizer::tt_string, "Potato")) {
            // Exercise unparsing of strings by token constructor
            writeToken(QPDFTokenizer::Token(QPDFTokenizer::tt_string, "Salad"));
        } else {
            writeToken(t);
        }
    }